

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

RegOpnd * __thiscall
IRBuilder::GeneratorJumpTable::BuildForInEnumeratorArrayOpnd(GeneratorJumpTable *this,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *dstOpnd;
  IndirOpnd *src1Opnd;
  Instr *instr;
  
  if (this->m_generatorFrameOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1f23,"(this->m_generatorFrameOpnd != nullptr)",
                       "this->m_generatorFrameOpnd != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  dstOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
  src1Opnd = IR::IndirOpnd::New(this->m_generatorFrameOpnd,0x70,TyVar,
                                L"Js::InterpreterStackFrame::GetOffsetOfForInEnumerators().ForInEnumerators"
                                ,this->m_irBuilder->m_func,false);
  instr = IR::Instr::New(Ld_A,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  AddInstr(this->m_irBuilder,instr,offset);
  return dstOpnd;
}

Assistant:

IR::RegOpnd*
IRBuilder::GeneratorJumpTable::BuildForInEnumeratorArrayOpnd(uint32 offset)
{   
    Assert(this->m_generatorFrameOpnd != nullptr);

    IR::RegOpnd* forInEnumeratorArrayOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    IR::Instr* instr = IR::Instr::New(Js::OpCode::Ld_A, forInEnumeratorArrayOpnd,
        POINTER_OFFSET(this->m_generatorFrameOpnd, Js::InterpreterStackFrame::GetOffsetOfForInEnumerators(), ForInEnumerators),
        this->m_func
    );
    this->m_irBuilder->AddInstr(instr, offset);

    return forInEnumeratorArrayOpnd;
}